

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

DdNode * Abc_NodeCollapseFunc
                   (Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,Vec_Ptr_t *vFanins,int *pPermFanin,
                   int *pPermFanout)

{
  int iVar1;
  int local_7c;
  int local_78;
  int iFanin;
  int nSize;
  int RetValue;
  DdNode *bFanout;
  DdNode *bFanin;
  DdNode *bTemp;
  DdNode *bFunc1;
  DdNode *bFunc0;
  DdNode *bVar;
  DdManager *dd;
  int *pPermFanout_local;
  int *pPermFanin_local;
  Vec_Ptr_t *vFanins_local;
  Abc_Obj_t *pFanout_local;
  Abc_Obj_t *pFanin_local;
  
  bVar = (DdNode *)pFanin->pNtk->pManFunc;
  dd = (DdManager *)pPermFanout;
  pPermFanout_local = pPermFanin;
  pPermFanin_local = &vFanins->nCap;
  vFanins_local = (Vec_Ptr_t *)pFanout;
  pFanout_local = pFanin;
  iVar1 = Abc_NodeCheckDupFanin(pFanin,pFanout,&local_7c);
  if (iVar1 == 1) {
    local_78 = Abc_NodeCollapseSuppSize
                         (pFanout_local,(Abc_Obj_t *)vFanins_local,(Vec_Ptr_t *)pPermFanin_local);
    bFunc0 = Cudd_bddIthVar((DdManager *)bVar,local_78 + -1);
    if (*(int *)&bVar[3].type < local_78) {
      __assert_fail("nSize <= dd->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcMinBase.c"
                    ,0x181,
                    "DdNode *Abc_NodeCollapseFunc(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
    iFanin = Abc_NodeCollapsePermMap
                       (pFanout_local,(Abc_Obj_t *)0x0,(Vec_Ptr_t *)pPermFanin_local,
                        pPermFanout_local);
    if (iFanin == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcMinBase.c"
                    ,0x184,
                    "DdNode *Abc_NodeCollapseFunc(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
    iFanin = Abc_NodeCollapsePermMap
                       ((Abc_Obj_t *)vFanins_local,pFanout_local,(Vec_Ptr_t *)pPermFanin_local,
                        (int *)dd);
    if (iFanin == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcMinBase.c"
                    ,0x186,
                    "DdNode *Abc_NodeCollapseFunc(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
    bFunc0 = Cudd_bddIthVar((DdManager *)bVar,local_7c);
    bFunc1 = Cudd_Cofactor((DdManager *)bVar,(DdNode *)vFanins_local[3].pArray,
                           (DdNode *)((ulong)bFunc0 ^ 1));
    Cudd_Ref(bFunc1);
    bTemp = Cudd_Cofactor((DdManager *)bVar,(DdNode *)vFanins_local[3].pArray,bFunc0);
    Cudd_Ref(bTemp);
    bFanin = bFunc1;
    bFunc1 = Cudd_bddPermute((DdManager *)bVar,bFunc1,(int *)dd);
    Cudd_Ref(bFunc1);
    Cudd_RecursiveDeref((DdManager *)bVar,bFanin);
    bFanin = bTemp;
    bTemp = Cudd_bddPermute((DdManager *)bVar,bTemp,(int *)dd);
    Cudd_Ref(bTemp);
    Cudd_RecursiveDeref((DdManager *)bVar,bFanin);
    bFanout = Cudd_bddPermute((DdManager *)bVar,(DdNode *)(pFanout_local->field_5).pData,
                              pPermFanout_local);
    Cudd_Ref(bFanout);
    _nSize = (Abc_Obj_t *)Cudd_bddIte((DdManager *)bVar,bFanout,bTemp,bFunc1);
    Cudd_Ref((DdNode *)_nSize);
    Cudd_RecursiveDeref((DdManager *)bVar,bFanout);
    Cudd_RecursiveDeref((DdManager *)bVar,bTemp);
    Cudd_RecursiveDeref((DdManager *)bVar,bFunc1);
    Cudd_Deref((DdNode *)_nSize);
    pFanin_local = _nSize;
  }
  else {
    pFanin_local = (Abc_Obj_t *)0x0;
  }
  return (DdNode *)pFanin_local;
}

Assistant:

DdNode * Abc_NodeCollapseFunc( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, Vec_Ptr_t * vFanins, int * pPermFanin, int * pPermFanout )
{
    DdManager * dd = (DdManager *)pFanin->pNtk->pManFunc;
    DdNode * bVar, * bFunc0, * bFunc1, * bTemp, * bFanin, * bFanout;
    int RetValue, nSize, iFanin;
    // can only eliminate if fanin occurs in the fanin list of the fanout exactly once
    if ( Abc_NodeCheckDupFanin( pFanin, pFanout, &iFanin ) != 1 )
        return NULL;
    // find the new number of fanins after collapsing
    nSize = Abc_NodeCollapseSuppSize( pFanin, pFanout, vFanins );
    bVar = Cudd_bddIthVar( dd, nSize - 1 );
    assert( nSize <= dd->size );
    // find the permutation after collapsing
    RetValue = Abc_NodeCollapsePermMap( pFanin, NULL, vFanins, pPermFanin );
    assert( RetValue );
    RetValue = Abc_NodeCollapsePermMap( pFanout, pFanin, vFanins, pPermFanout );
    assert( RetValue );
    // cofactor the local function of the node
    bVar   = Cudd_bddIthVar( dd, iFanin );
    bFunc0 = Cudd_Cofactor( dd, (DdNode *)pFanout->pData, Cudd_Not(bVar) ); Cudd_Ref( bFunc0 );
    bFunc1 = Cudd_Cofactor( dd, (DdNode *)pFanout->pData, bVar );           Cudd_Ref( bFunc1 );
    // find the permutation after collapsing
    bFunc0 = Cudd_bddPermute( dd, bTemp = bFunc0, pPermFanout );  Cudd_Ref( bFunc0 );
    Cudd_RecursiveDeref( dd, bTemp ); 
    bFunc1 = Cudd_bddPermute( dd, bTemp = bFunc1, pPermFanout );  Cudd_Ref( bFunc1 );
    Cudd_RecursiveDeref( dd, bTemp );
    bFanin = Cudd_bddPermute( dd, (DdNode *)pFanin->pData, pPermFanin );    Cudd_Ref( bFanin );
    // create the new function
    bFanout = Cudd_bddIte( dd, bFanin, bFunc1, bFunc0 );          Cudd_Ref( bFanout );
    Cudd_RecursiveDeref( dd, bFanin );
    Cudd_RecursiveDeref( dd, bFunc1 );
    Cudd_RecursiveDeref( dd, bFunc0 );
    Cudd_Deref( bFanout );
    return bFanout;
}